

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_ptr_field.h
# Opt level: O2

bool __thiscall
__gnu_cxx::__ops::_Iter_equals_val<std::__cxx11::string_const>::operator()
          (_Iter_equals_val<std::__cxx11::string_const> *this,
          RepeatedPtrIterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          __it)

{
  __type _Var1;
  
  _Var1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          *__it.it_,
                          *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                           this);
  return _Var1;
}

Assistant:

reference operator*() const { return *reinterpret_cast<Element*>(*it_); }